

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          char *makefile,string *target)

{
  bool bVar1;
  string makefileName;
  string generator;
  string sStack_b8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\"",(allocator<char> *)&local_50);
  std::operator+(&local_50,make,"\"");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_50);
  bVar1 = std::operator==(&local_50,"NMake Makefiles");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_b8,makefile,(allocator<char> *)&local_90);
    cmSystemTools::ConvertToOutputPath(&local_70,&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::operator+(&sStack_b8,&local_70,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::operator+(&local_90,", \"",target);
    std::operator+(&sStack_b8,&local_90,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==(&local_50,"Ninja");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_b8,makefile,(allocator<char> *)&local_90);
      cmSystemTools::ConvertToOutputPath(&local_70,&sStack_b8);
      std::__cxx11::string::~string((string *)&sStack_b8);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&sStack_b8,&local_70,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_b8);
      std::operator+(&local_90,", \"",target);
      std::operator+(&sStack_b8,&local_90,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      bVar1 = std::operator==(&local_50,"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::assign((char *)&local_70);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,makefile,&local_91);
        cmSystemTools::ConvertToOutputPath(&sStack_b8,&local_90);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&sStack_b8);
        std::__cxx11::string::~string((string *)&sStack_b8);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&sStack_b8,&local_70,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_b8);
      std::operator+(&local_90,", \"",target);
      std::operator+(&sStack_b8,&local_90,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const char* makefile, const std::string& target)
{
  std::string command = "\"";
  command += make + "\"";
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}